

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_localize_ghost_int(REF_NODE ref_node,REF_INT *scalar)

{
  int iVar1;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar2;
  REF_INT *pRVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  REF_INT *pRVar7;
  long lVar8;
  void *pvVar9;
  void *recv;
  void *recv_00;
  int *__ptr;
  long lVar10;
  undefined8 uVar11;
  REF_INT *send_size;
  REF_STATUS RVar12;
  ulong uVar13;
  int iVar14;
  char *pcVar15;
  ulong uVar16;
  REF_INT local;
  REF_STATUS local_74;
  int local_3c;
  void *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  if ((long)ref_mpi->n < 2) {
    return 0;
  }
  pRVar7 = (REF_INT *)malloc((long)ref_mpi->n << 2);
  if (pRVar7 == (REF_INT *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x4c8,
           "ref_node_localize_ghost_int","malloc a_size of REF_INT NULL");
    send_size = (REF_INT *)0x0;
  }
  else {
    send_size = pRVar7;
    if (0 < ref_mpi->n) {
      lVar8 = 0;
      do {
        pRVar7[lVar8] = 0;
        lVar8 = lVar8 + 1;
      } while (lVar8 < ref_mpi->n);
    }
  }
  RVar12 = 2;
  if (pRVar7 == (REF_INT *)0x0) {
    return 2;
  }
  if ((long)ref_mpi->n < 0) {
    local_74 = 1;
    pcVar15 = "malloc b_size of REF_INT negative";
LAB_0013da26:
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x4c9,
           "ref_node_localize_ghost_int",pcVar15);
    pRVar7 = (REF_INT *)0x0;
  }
  else {
    pRVar7 = (REF_INT *)malloc((long)ref_mpi->n << 2);
    if (pRVar7 == (REF_INT *)0x0) {
      local_74 = 2;
      pcVar15 = "malloc b_size of REF_INT NULL";
      goto LAB_0013da26;
    }
    local_74 = 2;
    bVar4 = true;
    if (0 < ref_mpi->n) {
      lVar8 = 0;
      do {
        pRVar7[lVar8] = 0;
        lVar8 = lVar8 + 1;
      } while (lVar8 < ref_mpi->n);
    }
  }
  if (!bVar4) {
    return local_74;
  }
  iVar14 = ref_node->max;
  if (0 < (long)iVar14) {
    pRVar2 = ref_node->global;
    lVar8 = 0;
    do {
      if ((-1 < pRVar2[lVar8]) && (ref_node->ref_mpi->id != ref_node->part[lVar8])) {
        send_size[ref_node->part[lVar8]] = send_size[ref_node->part[lVar8]] + 1;
      }
      lVar8 = lVar8 + 1;
    } while (iVar14 != lVar8);
  }
  uVar5 = ref_mpi_alltoall(ref_mpi,send_size,pRVar7,1);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x4d2,
           "ref_node_localize_ghost_int",(ulong)uVar5,"alltoall sizes");
    return uVar5;
  }
  iVar14 = ref_mpi->n;
  lVar8 = (long)iVar14;
  if (lVar8 < 1) {
    uVar5 = 0;
  }
  else {
    lVar10 = 0;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + send_size[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar8 != lVar10);
  }
  if ((int)uVar5 < 0) {
    pcVar15 = "malloc a_global of REF_GLOB negative";
    uVar11 = 0x4d6;
LAB_0013db83:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar11,
           "ref_node_localize_ghost_int",pcVar15);
    RVar12 = 1;
  }
  else {
    pvVar9 = malloc((ulong)uVar5 * 8);
    if (pvVar9 == (void *)0x0) {
      pcVar15 = "malloc a_global of REF_GLOB NULL";
      uVar11 = 0x4d6;
    }
    else {
      local_38 = pvVar9;
      pvVar9 = malloc((ulong)uVar5 << 2);
      if (pvVar9 == (void *)0x0) {
        pcVar15 = "malloc a_scalar of REF_INT NULL";
        uVar11 = 0x4d7;
      }
      else {
        if (iVar14 < 1) {
          uVar5 = 0;
        }
        else {
          lVar10 = 0;
          uVar5 = 0;
          do {
            uVar5 = uVar5 + pRVar7[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar8 != lVar10);
        }
        if ((int)uVar5 < 0) {
          pcVar15 = "malloc b_global of REF_GLOB negative";
          uVar11 = 0x4db;
          goto LAB_0013db83;
        }
        recv = malloc((ulong)uVar5 * 8);
        if (recv == (void *)0x0) {
          pcVar15 = "malloc b_global of REF_GLOB NULL";
          uVar11 = 0x4db;
        }
        else {
          recv_00 = malloc((ulong)uVar5 << 2);
          if (recv_00 == (void *)0x0) {
            pcVar15 = "malloc b_scalar of REF_INT NULL";
            uVar11 = 0x4dc;
          }
          else {
            if (iVar14 < 0) {
              pcVar15 = "malloc a_next of REF_INT negative";
              uVar11 = 0x4de;
              goto LAB_0013db83;
            }
            __ptr = (int *)malloc(lVar8 * 4);
            if (__ptr != (int *)0x0) {
              *__ptr = 0;
              if (1 < iVar14) {
                iVar14 = *__ptr;
                lVar10 = 0;
                do {
                  iVar14 = iVar14 + send_size[lVar10];
                  __ptr[lVar10 + 1] = iVar14;
                  lVar10 = lVar10 + 1;
                } while (lVar8 + -1 != lVar10);
              }
              iVar14 = ref_node->max;
              if (0 < (long)iVar14) {
                pRVar2 = ref_node->global;
                lVar8 = 0;
                do {
                  if (-1 < pRVar2[lVar8]) {
                    pRVar3 = ref_node->part;
                    iVar1 = pRVar3[lVar8];
                    if (ref_node->ref_mpi->id != iVar1) {
                      iVar1 = __ptr[iVar1];
                      *(REF_GLOB *)((long)local_38 + (long)iVar1 * 8) = pRVar2[lVar8];
                      *(REF_INT *)((long)pvVar9 + (long)iVar1 * 4) = scalar[lVar8];
                      __ptr[pRVar3[lVar8]] = __ptr[pRVar3[lVar8]] + 1;
                    }
                  }
                  lVar8 = lVar8 + 1;
                } while (iVar14 != lVar8);
              }
              uVar6 = ref_mpi_alltoallv(ref_mpi,local_38,send_size,recv,pRVar7,1,2);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x4ef,"ref_node_localize_ghost_int",(ulong)uVar6,"alltoallv global");
                return uVar6;
              }
              uVar6 = ref_mpi_alltoallv(ref_mpi,pvVar9,send_size,recv_00,pRVar7,1,1);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x4f3,"ref_node_localize_ghost_int",(ulong)uVar6,"alltoallv scalar");
                return uVar6;
              }
              if (uVar5 != 0) {
                uVar16 = 1;
                if (1 < (int)uVar5) {
                  uVar16 = (ulong)uVar5;
                }
                uVar13 = 0;
                do {
                  uVar5 = ref_node_local(ref_node,*(REF_GLOB *)((long)recv + uVar13 * 8),&local_3c);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0x4f6,"ref_node_localize_ghost_int",(ulong)uVar5,"g2l");
                    return uVar5;
                  }
                  scalar[local_3c] = scalar[local_3c] + *(int *)((long)recv_00 + uVar13 * 4);
                  uVar13 = uVar13 + 1;
                } while (uVar16 != uVar13);
              }
              if (0 < ref_node->max) {
                pRVar2 = ref_node->global;
                lVar8 = 0;
                do {
                  if ((-1 < pRVar2[lVar8]) && (ref_node->ref_mpi->id != ref_node->part[lVar8])) {
                    scalar[lVar8] = 0;
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 < ref_node->max);
              }
              free(__ptr);
              free(recv_00);
              free(recv);
              free(pvVar9);
              free(local_38);
              free(pRVar7);
              free(send_size);
              return 0;
            }
            pcVar15 = "malloc a_next of REF_INT NULL";
            uVar11 = 0x4de;
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar11,
           "ref_node_localize_ghost_int",pcVar15);
  }
  return RVar12;
}

Assistant:

REF_FCN REF_STATUS ref_node_localize_ghost_int(REF_NODE ref_node,
                                               REF_INT *scalar) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_GLOB *a_global, *b_global;
  REF_INT part, node;
  REF_INT *a_next;
  REF_INT *a_scalar, *b_scalar;
  REF_INT local;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      a_size[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) { a_total += a_size[part]; }
  ref_malloc(a_global, a_total, REF_GLOB);
  ref_malloc(a_scalar, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) { b_total += b_size[part]; }
  ref_malloc(b_global, b_total, REF_GLOB);
  ref_malloc(b_scalar, b_total, REF_INT);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_scalar[a_next[part]] = scalar[node];
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_size, b_global, b_size, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");

  RSS(ref_mpi_alltoallv(ref_mpi, a_scalar, a_size, b_scalar, b_size, 1,
                        REF_INT_TYPE),
      "alltoallv scalar");

  for (node = 0; node < b_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    scalar[local] += b_scalar[node];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      scalar[node] = 0;
    }
  }

  free(a_next);
  free(b_scalar);
  free(b_global);
  free(a_scalar);
  free(a_global);
  free(b_size);
  free(a_size);

  return REF_SUCCESS;
}